

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileString.cpp
# Opt level: O0

void __thiscall Js::StringProfiler::RecordNewString(StringProfiler *this,char16 *sz,uint length)

{
  bool bVar1;
  uint uVar2;
  undefined1 local_2c [4];
  uint embeddedNULs;
  StringMetrics metrics;
  RequiredEncoding encoding;
  uint length_local;
  char16 *sz_local;
  StringProfiler *this_local;
  
  metrics.countUnicode = length;
  bVar1 = IsOnWrongThread(this);
  if (bVar1) {
    InterlockedIncrement<unsigned_int>(&this->discardedWrongThread);
  }
  else {
    metrics.count8BitASCII = 0;
    if (sz != (char16 *)0x0) {
      metrics.count8BitASCII = GetRequiredEncoding(sz,metrics.countUnicode);
    }
    memset(local_2c,0,0xc);
    bVar1 = JsUtil::
            BaseDictionary<unsigned_int,_Js::StringProfiler::StringMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetValue<unsigned_int>
                      (&this->stringLengthMetrics,&metrics.countUnicode,(StringMetrics *)local_2c);
    if (bVar1) {
      StringMetrics::Accumulate((StringMetrics *)local_2c,metrics.count8BitASCII);
      JsUtil::
      BaseDictionary<unsigned_int,_Js::StringProfiler::StringMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Item(&this->stringLengthMetrics,&metrics.countUnicode,(StringMetrics *)local_2c);
    }
    else {
      StringMetrics::Accumulate((StringMetrics *)local_2c,metrics.count8BitASCII);
      JsUtil::
      BaseDictionary<unsigned_int,_Js::StringProfiler::StringMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Add(&this->stringLengthMetrics,&metrics.countUnicode,(StringMetrics *)local_2c);
    }
    if ((sz != (char16 *)0x0) && (uVar2 = CountEmbeddedNULs(sz,metrics.countUnicode), uVar2 != 0)) {
      this->embeddedNULChars = uVar2 + this->embeddedNULChars;
      this->embeddedNULStrings = this->embeddedNULStrings + 1;
    }
  }
  return;
}

Assistant:

void StringProfiler::RecordNewString( const char16* sz, uint length )
    {
        if( IsOnWrongThread() )
        {
            ::InterlockedIncrement(&discardedWrongThread);
            return;
        }
        RequiredEncoding encoding = ASCII7bit;
        if(sz)
        {
            encoding = GetRequiredEncoding(sz, length);
        }

        StringMetrics metrics = {};

        if( stringLengthMetrics.TryGetValue(length, &metrics) )
        {
            metrics.Accumulate(encoding);
            stringLengthMetrics.Item(length,metrics);
        }
        else
        {
            metrics.Accumulate(encoding);
            stringLengthMetrics.Add(length,metrics);
        }

        if(sz)
        {
            uint embeddedNULs = CountEmbeddedNULs(sz, length);
            if( embeddedNULs != 0 )
            {

                this->embeddedNULChars += embeddedNULs;
                this->embeddedNULStrings++;
            }
        }
    }